

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

bool Js::BinarySearchForLocale<&unum_getAvailable_70,&unum_countAvailable_70>(char *localeID)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  char *__s2;
  char *pcVar7;
  int res;
  char *cur;
  uint local_28;
  int i;
  int iterations;
  int right;
  int left;
  int count;
  char *localeID_local;
  
  iVar3 = unum_countAvailable_70();
  iterations = 0;
  i = iVar3 + -1;
  local_28 = 0;
  while( true ) {
    local_28 = local_28 + 1;
    if (i < iterations) {
      Output::Trace(IntlPhase,L"%S(): Could not find localeID %S in %d iterations\n",
                    "BinarySearchForLocale",localeID,(ulong)local_28);
      return false;
    }
    iVar4 = (iterations + i) / 2;
    if ((iVar4 < 0) || (iVar3 <= iVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3ec,"(i >= 0 && i < count)","i >= 0 && i < count");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    __s2 = (char *)unum_getAvailable_70(iVar4);
    if (0 < iVar4) {
      pcVar7 = (char *)unum_getAvailable_70(iVar4 + -1);
      iVar5 = strcmp(pcVar7,__s2);
      if (-1 < iVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f1,
                                    "(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true)"
                                    ,
                                    "i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    if (iVar4 < iVar3 + -1) {
      pcVar7 = (char *)unum_getAvailable_70(iVar4 + 1);
      iVar5 = strcmp(pcVar7,__s2);
      if (iVar5 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3f2,
                                    "(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true)"
                                    ,
                                    "i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    iVar5 = strcmp(localeID,__s2);
    if (iVar5 == 0) break;
    if (iVar5 < 0) {
      i = iVar4 + -1;
    }
    else {
      iterations = iVar4 + 1;
    }
  }
  Output::Trace(IntlPhase,L"%S(): Found localeID %S in %d iterations\n","BinarySearchForLocale",
                localeID,(ulong)local_28);
  return true;
}

Assistant:

static bool BinarySearchForLocale(const char *localeID)
    {
        const int count = CountAvailableLocalesFunc();
        int left = 0;
        int right = count - 1;
        int iterations = 0;
        while (true)
        {
            iterations += 1;
            if (left > right)
            {
                INTL_TRACE("Could not find localeID %S in %d iterations", localeID, iterations);
                return false;
            }

            int i = (left + right) / 2;
            Assert(i >= 0 && i < count);

            const char *cur = GetAvailableLocalesFunc(i);

            // Ensure that this list is actually binary searchable
            Assert(i > 0 ? strcmp(GetAvailableLocalesFunc(i - 1), cur) < 0 : true);
            Assert(i < count - 1 ? strcmp(GetAvailableLocalesFunc(i + 1), cur) > 0 : true);

            int res = strcmp(localeID, cur);
            if (res == 0)
            {
                INTL_TRACE("Found localeID %S in %d iterations", localeID, iterations);
                return true;
            }
            else if (res < 0)
            {
                right = i - 1;
            }
            else
            {
                left = i + 1;
            }
        }
    }